

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O0

void b64From(char *dest,void *src,size_t count)

{
  byte bVar1;
  ushort uVar2;
  uint3 uVar3;
  uint uVar4;
  u32 block;
  size_t count_local;
  void *src_local;
  char *dest_local;
  
  src_local = src;
  dest_local = dest;
  for (count_local = count; 2 < count_local; count_local = count_local - 3) {
    bVar1 = *src_local;
    uVar2 = CONCAT11(bVar1,*(undefined1 *)((long)src_local + 1));
    uVar3 = CONCAT21(uVar2,*(undefined1 *)((long)src_local + 2));
    dest_local[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar3 & 0x3f]
    ;
    dest_local[2] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar3 >> 6 & 0x3f];
    dest_local[1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar2 >> 4 & 0x3f];
    *dest_local = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
    src_local = (void *)((long)src_local + 3);
    dest_local = dest_local + 4;
  }
  if (count_local == 2) {
    uVar4 = (uint)CONCAT11(*src_local,*(undefined1 *)((long)src_local + 1)) << 2;
    dest_local[3] = '=';
    dest_local[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar4 & 0x3f]
    ;
    dest_local[1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar4 >> 6 & 0x3f];
    *dest_local = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar4 >> 0xc];
    dest_local = dest_local + 4;
  }
  else if (count_local == 1) {
    bVar1 = *src_local;
    dest_local[2] = '=';
    dest_local[3] = '=';
    dest_local[1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(uint)bVar1 << 4 & 0x3f]
    ;
    *dest_local = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [((uint)bVar1 << 4) >> 6];
    dest_local = dest_local + 4;
  }
  *dest_local = '\0';
  return;
}

Assistant:

void b64From(char* dest, const void* src, size_t count)
{
	register u32 block;
	ASSERT(memIsDisjoint2(src, count, dest, 4 * ((count + 2) / 3) + 1));
	for (; count >= 3; count -= 3)
	{
		block  = ((const octet*)src)[0], block <<= 8;
		block |= ((const octet*)src)[1], block <<= 8;
		block |= ((const octet*)src)[2];
		dest[3] = b64_alphabet[block & 63], block >>= 6;
		dest[2] = b64_alphabet[block & 63], block >>= 6;
		dest[1] = b64_alphabet[block & 63], block >>= 6;
		dest[0] = b64_alphabet[block];
		src = (const octet*)src + 3;
		dest += 4;
	}
	if (count == 2)
	{
		block  = ((const octet*)src)[0], block <<= 8;
		block |= ((const octet*)src)[1], block <<= 2;
		dest[3] = '=';
		dest[2] = b64_alphabet[block & 63], block >>= 6;
		dest[1] = b64_alphabet[block & 63], block >>= 6;
		dest[0] = b64_alphabet[block];
		dest += 4;
	}
	else if (count == 1)
	{
		block  = ((const octet*)src)[0], block <<= 4;
		dest[3] = dest[2] = '=';
		dest[1] = b64_alphabet[block & 63], block >>= 6;
		dest[0] = b64_alphabet[block];
		dest += 4;
	}
	*dest = '\0';
	block = 0;
}